

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O1

Vec_Int_t * Bmc_ManBCoreCollect(Gia_Man_t *p,int iFrame,int iOut,sat_solver *pSat)

{
  int iVar1;
  uint uVar2;
  sat_solver *s;
  Vec_Int_t *pVVar3;
  int iVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  Vec_Int_t *pVVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint local_94;
  uint local_90;
  uint local_8c;
  ulong local_88;
  uint local_7c;
  Vec_Int_t *local_78;
  Vec_Int_t *local_70;
  int local_64;
  Vec_Int_t *local_60;
  Gia_Man_t *local_58;
  Gia_Obj_t *local_50;
  ulong local_48;
  sat_solver *local_40;
  Vec_Int_t *local_38;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_00->pArray = piVar5;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar6->pArray = piVar5;
  local_60 = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar6->pArray = piVar5;
  local_7c = iFrame;
  local_78 = pVVar6;
  if ((iOut | iFrame) < 0) {
    __assert_fail("iFrame >= 0 && iOut >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                  ,0x7c,"Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)");
  }
  Vec_IntPush(p_00,-1);
  Vec_IntPush(p_00,-1);
  pVVar12 = local_60;
  pVVar6 = local_78;
  iVar4 = p->vCos->nSize;
  if (iVar4 - p->nRegs <= iOut) {
LAB_0055f2fd:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((iOut < 0) || (iVar4 <= iOut)) {
LAB_0055f16a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  local_48 = (ulong)(uint)iOut;
  iVar4 = p->vCos->pArray[local_48];
  if ((-1 < (long)iVar4) && (iVar1 = p->nObjs, iVar4 < iVar1)) {
    local_64 = iOut;
    if (p_00->nSize < 0) {
LAB_0055f243:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    p->pObjs[iVar4].Value = (uint)p_00->nSize >> 1;
    if (iVar1 <= iVar4) {
LAB_0055f224:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    Vec_IntPush(p_00,iVar4);
    Vec_IntPush(p_00,local_7c);
    iVar4 = p->vCos->nSize;
    if (iVar4 - p->nRegs <= local_64) goto LAB_0055f2fd;
    if (iVar4 <= local_64) goto LAB_0055f16a;
    iVar4 = p->vCos->pArray[local_48];
    if ((-1 < iVar4) && (iVar4 < p->nObjs)) {
      Vec_IntPush(pVVar12,iVar4);
      uVar9 = (ulong)local_7c;
      local_58 = p;
      local_40 = pSat;
      pVVar3 = p_00;
      if (-1 < (int)local_7c) {
        do {
          local_38 = pVVar3;
          local_88 = uVar9;
          Gia_ManIncrementTravId(p);
          if (p->nObjs < 1) goto LAB_0055f224;
          if (p->nTravIdsAlloc < 1) {
            __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
          }
          pGVar8 = p->pObjs;
          *p->pTravIds = p->nTravIds;
          if (p_00->nSize < 0) goto LAB_0055f243;
          pGVar8->Value = (uint)p_00->nSize >> 1;
          if (p->nObjs < 1) goto LAB_0055f224;
          Vec_IntPush(p_00,0);
          Vec_IntPush(p_00,(int)local_88);
          uVar10 = p->pObjs->Value;
          if ((int)uVar10 < 0) {
            __assert_fail("iVar >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x15f,"int sat_solver_add_const(sat_solver *, int, int)");
          }
          local_94 = uVar10 * 2 + 1;
          iVar4 = sat_solver_addclause(pSat,(lit *)&local_94,(lit *)&local_90);
          if (iVar4 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x163,"int sat_solver_add_const(sat_solver *, int, int)");
          }
          pVVar6->nSize = 0;
          local_78 = (Vec_Int_t *)(ulong)(uint)p_00->nSize;
          if (0 < pVVar12->nSize) {
            lVar11 = 0;
            do {
              iVar4 = pVVar12->pArray[lVar11];
              if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_0055f14b;
              if (p->pObjs == (Gia_Obj_t *)0x0) break;
              Bmc_ManBCoreCollect_rec
                        (p,iVar4 - (*(uint *)(p->pObjs + iVar4) & 0x1fffffff),(int)local_88,p_00,
                         pVVar6);
              lVar11 = lVar11 + 1;
            } while (lVar11 < pVVar12->nSize);
          }
          local_70 = pVVar6;
          local_60 = pVVar12;
          if ((uint)local_88 == local_7c) {
            iVar4 = p->vCos->nSize;
            if (iVar4 - p->nRegs <= local_64) goto LAB_0055f2fd;
            if (iVar4 <= local_64) goto LAB_0055f16a;
            iVar4 = p->vCos->pArray[local_48];
            lVar11 = (long)iVar4;
            if ((lVar11 < 0) || (p->nObjs <= iVar4)) goto LAB_0055f14b;
            if (p->pObjs[lVar11].Value != 1) {
              __assert_fail("pObj->Value == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                            ,0x94,
                            "Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)");
            }
            pGVar8 = p->pObjs + lVar11;
            uVar10 = (uint)*(undefined8 *)pGVar8;
            if (pGVar8[-(ulong)(uVar10 & 0x1fffffff)].Value != 3) {
              __assert_fail("Gia_ObjFanin0(pObj)->Value == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                            ,0x95,
                            "Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)");
            }
            uVar10 = uVar10 >> 0x1d | 6;
            local_90 = 2;
            local_94 = uVar10;
            iVar4 = sat_solver_addclause(pSat,(lit *)&local_94,(lit *)&local_8c);
            if (iVar4 == 0) goto LAB_0055f2bf;
            local_90 = 3;
            local_94 = uVar10;
            iVar4 = sat_solver_addclause(pSat,(lit *)&local_94,(lit *)&local_8c);
            if (iVar4 == 0) goto LAB_0055f2de;
          }
          else if (0 < pVVar12->nSize) {
            lVar11 = 0;
            do {
              iVar4 = local_60->pArray[lVar11];
              if (((long)iVar4 < 0) || (local_58->nObjs <= iVar4)) goto LAB_0055f14b;
              pVVar6 = local_70;
              if (local_58->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar8 = local_58->pObjs + iVar4;
              uVar10 = pGVar8[-(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)].Value;
              if ((int)(uVar10 | pGVar8->Value) < 0) {
                __assert_fail("iVarA >= 0 && iVarB >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                              ,0x16a,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
              }
              uVar15 = (uint)*(undefined8 *)pGVar8 >> 0x1d & 1;
              uVar2 = pGVar8->Value * 2;
              local_90 = uVar15 + uVar10 * 2 ^ 1;
              local_94 = uVar2;
              iVar4 = sat_solver_addclause(pSat,(lit *)&local_94,(lit *)&local_8c);
              if (iVar4 != 0) {
                local_94 = uVar2 | 1;
                local_90 = uVar15 | uVar10 * 2;
                sat_solver_addclause(pSat,(lit *)&local_94,(lit *)&local_8c);
              }
              lVar11 = lVar11 + 1;
              p_00 = local_38;
              pVVar6 = local_70;
            } while (lVar11 < local_60->nSize);
          }
          p = local_58;
          if (0 < pVVar6->nSize) {
            lVar11 = 0;
            do {
              iVar4 = pVVar6->pArray[lVar11];
              if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_0055f14b;
              if (p->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar8 = p->pObjs + iVar4;
              pGVar7 = Gia_ObjRiToRo(p,pGVar8);
              pGVar8->Value = pGVar7->Value;
              lVar11 = lVar11 + 1;
              pVVar6 = local_70;
            } while (lVar11 < local_70->nSize);
          }
          pVVar6 = local_78;
          pVVar12 = local_78;
          if ((int)local_78 < p_00->nSize) {
            do {
              if ((int)pVVar12 < 0) goto LAB_0055f16a;
              lVar11 = (long)p_00->pArray[(long)pVVar6];
              if ((lVar11 < 0) || (p->nObjs <= p_00->pArray[(long)pVVar6])) goto LAB_0055f14b;
              pGVar8 = p->pObjs;
              uVar9 = *(ulong *)(pGVar8 + lVar11);
              uVar10 = (uint)uVar9;
              if ((~uVar10 & 0x9fffffff) != 0) {
                if (((int)uVar10 < 0) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
                  __assert_fail("Gia_ObjIsAnd(pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                                ,0xa7,
                                "Vec_Int_t *Bmc_ManBCoreCollect(Gia_Man_t *, int, int, sat_solver *)"
                               );
                }
                local_50 = (Gia_Obj_t *)(ulong)pGVar8[lVar11].Value;
                uVar10 = pGVar8[lVar11 - (ulong)(uVar10 & 0x1fffffff)].Value;
                uVar15 = (uint)(uVar9 >> 0x20);
                uVar2 = pGVar8[lVar11 - (ulong)(uVar15 & 0x1fffffff)].Value;
                uVar14 = (uint)(uVar9 >> 0x1d) & 1;
                uVar13 = pGVar8[lVar11].Value * 2 + 1;
                local_90 = uVar14 + uVar10 * 2;
                local_94 = uVar13;
                iVar4 = sat_solver_addclause(pSat,(lit *)&local_94,(lit *)&local_8c);
                pSat = local_40;
                if (iVar4 == 0) {
                  __assert_fail("Cid",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                                ,0x196,
                                "int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)"
                               );
                }
                uVar15 = uVar15 >> 0x1d & 1;
                local_90 = uVar15 + uVar2 * 2;
                local_94 = uVar13;
                iVar4 = sat_solver_addclause(local_40,(lit *)&local_94,(lit *)&local_8c);
                if (iVar4 == 0) {
                  __assert_fail("Cid",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                                ,0x19b,
                                "int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)"
                               );
                }
                local_94 = (int)local_50 * 2;
                local_90 = (uVar10 * 2 | uVar14) ^ 1;
                local_8c = (uVar2 * 2 | uVar15) ^ 1;
                iVar4 = sat_solver_addclause(pSat,(lit *)&local_94,(lit *)&local_88);
                pVVar12 = local_78;
                p_00 = local_38;
                p = local_58;
                if (iVar4 == 0) {
                  __assert_fail("Cid",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                                ,0x1a1,
                                "int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)"
                               );
                }
              }
              pVVar6 = (Vec_Int_t *)((long)&pVVar6->nCap + 2);
            } while ((int)pVVar6 < p_00->nSize);
          }
          iVar4 = (int)local_88;
          local_88 = (ulong)(iVar4 - 1);
          pVVar12 = local_70;
          pVVar6 = local_60;
          uVar9 = local_88;
          pVVar3 = local_38;
        } while (0 < iVar4);
      }
      if (0 < pVVar12->nSize) {
        uVar9 = 0;
        local_78 = pVVar6;
        local_70 = pVVar12;
        do {
          s = local_40;
          iVar4 = local_70->pArray[uVar9];
          if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_0055f14b;
          pVVar12 = local_70;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          uVar10 = p_00->nSize;
          if ((int)uVar10 < 0) goto LAB_0055f243;
          local_50 = p->pObjs + iVar4;
          local_88 = uVar9;
          if ((int)local_50->Value < 0) {
            __assert_fail("iVar >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x25c,"int sat_solver_add_constraint(sat_solver *, int, int, int)");
          }
          local_90 = uVar10 & 0x7ffffffe;
          uVar2 = local_50->Value * 2 + 1;
          local_94 = uVar2;
          iVar4 = sat_solver_addclause(local_40,(lit *)&local_94,(lit *)&local_8c);
          if (iVar4 == 0) {
LAB_0055f2bf:
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x261,"int sat_solver_add_constraint(sat_solver *, int, int, int)");
          }
          local_90 = uVar10 | 1;
          local_94 = uVar2;
          iVar4 = sat_solver_addclause(s,(lit *)&local_94,(lit *)&local_8c);
          p = local_58;
          if (iVar4 == 0) {
LAB_0055f2de:
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0x266,"int sat_solver_add_constraint(sat_solver *, int, int, int)");
          }
          pGVar8 = Gia_ObjRiToRo(local_58,local_50);
          pVVar6 = local_78;
          if (p_00->nSize < 0) goto LAB_0055f243;
          pGVar8->Value = (uint)p_00->nSize >> 1;
          pGVar7 = p->pObjs;
          if ((pGVar8 < pGVar7) || (pGVar7 + p->nObjs <= pGVar8)) goto LAB_0055f224;
          Vec_IntPush(p_00,(int)((ulong)((long)pGVar8 - (long)pGVar7) >> 2) * -0x55555555);
          Vec_IntPush(p_00,-1);
          uVar9 = local_88 + 1;
          pVVar12 = local_70;
        } while ((long)uVar9 < (long)local_70->nSize);
      }
      if (pVVar12->pArray != (int *)0x0) {
        free(pVVar12->pArray);
        pVVar12->pArray = (int *)0x0;
      }
      if (pVVar12 != (Vec_Int_t *)0x0) {
        free(pVVar12);
      }
      if (pVVar6->pArray != (int *)0x0) {
        free(pVVar6->pArray);
        pVVar6->pArray = (int *)0x0;
      }
      if (pVVar6 != (Vec_Int_t *)0x0) {
        free(pVVar6);
      }
      return p_00;
    }
  }
LAB_0055f14b:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

Vec_Int_t * Bmc_ManBCoreCollect( Gia_Man_t * p, int iFrame, int iOut, sat_solver * pSat )
{
    Gia_Obj_t * pObj; 
    int f, i, iObj, nNodesOld;
    Vec_Int_t * vNodes  = Vec_IntAlloc( 100 );
    Vec_Int_t * vRoots  = Vec_IntAlloc( 100 );
    Vec_Int_t * vRoots2 = Vec_IntAlloc( 100 );
    assert( iFrame >= 0 && iOut >= 0 );
    // add first variables
    Vec_IntPush( vNodes, -1 );
    Vec_IntPush( vNodes, -1 );
    Bmc_ManBCoreAssignVar( p, Gia_ManPo(p, iOut), iFrame, vNodes );
    // start with root node
    Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ManPo(p, iOut)) );
    // iterate through time frames
    for ( f = iFrame; f >= 0; f-- )
    {
        Gia_ManIncrementTravId( p );
        // add constant node
        Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
        Bmc_ManBCoreAssignVar( p, Gia_ManConst0(p), f, vNodes );
        sat_solver_add_const( pSat, Gia_ManConst0(p)->Value, 1 );
        // collect nodes in this timeframe
        Vec_IntClear( vRoots2 );
        nNodesOld = Vec_IntSize(vNodes);
        Gia_ManForEachObjVec( vRoots, p, pObj, i )
            Bmc_ManBCoreCollect_rec( p, Gia_ObjFaninId0p(p, pObj), f, vNodes, vRoots2 );
        if ( f == iFrame )
        {
            // add the final clause
            pObj = Gia_ManPo(p, iOut);
            assert( pObj->Value == 1 );
            assert( Gia_ObjFanin0(pObj)->Value == 3 );
//            sat_solver_add_const( pSat, Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
            sat_solver_add_constraint( pSat, Gia_ObjFanin0(pObj)->Value, pObj->Value, Gia_ObjFaninC0(pObj) );
        }
        else
        {
            // connect current RIs to previous ROs
            Gia_ManForEachObjVec( vRoots, p, pObj, i )
                sat_solver_add_buffer( pSat, pObj->Value, Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
        }
        Gia_ManForEachObjVec( vRoots2, p, pObj, i )
            pObj->Value = Gia_ObjRiToRo(p, pObj)->Value;
        // add nodes of this timeframe
        Vec_IntForEachEntryStart( vNodes, iObj, i, nNodesOld )
        {
            pObj = Gia_ManObj(p, iObj); i++;
            if ( Gia_ObjIsCi(pObj) )
                continue;
            assert( Gia_ObjIsAnd(pObj) );
            sat_solver_add_and( pSat, pObj->Value, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value, Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 );
        }
        // collect constant node
        ABC_SWAP( Vec_Int_t *, vRoots, vRoots2 );
    }
    // add constraint variables for the init state
    Gia_ManForEachObjVec( vRoots, p, pObj, i )
    {
        sat_solver_add_constraint( pSat, pObj->Value, Abc_Lit2Var(Vec_IntSize(vNodes)), 1 );
        pObj = Gia_ObjRiToRo(p, pObj);
        Bmc_ManBCoreAssignVar( p, pObj, -1, vNodes );
    }
    Vec_IntFree( vRoots );
    Vec_IntFree( vRoots2 );
    return vNodes;
}